

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_corofile.cpp
# Opt level: O3

void test_random_read_write<(coro_io::execution_type)2>(string_view filename)

{
  atomic<unsigned_long> *paVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  io_context_pool *piVar4;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy_00;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy_01;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy_02;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view buf_00;
  string buf1;
  basic_random_coro_file<(coro_io::execution_type)2> file1;
  pair<std::error_code,_unsigned_long> pair;
  string buf2;
  basic_random_coro_file<(coro_io::execution_type)2> file;
  char buf [100];
  undefined1 local_1e8 [20];
  undefined2 uStack_1d4;
  undefined1 uStack_1d2;
  undefined1 uStack_1d1;
  undefined1 local_1d0 [8];
  undefined1 local_1c8 [8];
  undefined1 local_1c0 [24];
  element_type local_1a8 [2];
  basic_executor_type<std::allocator<void>,_0UL> local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider _Stack_188;
  char *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined1 local_160;
  pair<std::error_code,_unsigned_long> local_158;
  pair<std::error_code,_unsigned_long> local_138;
  undefined1 local_118 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  basic_executor_type<std::allocator<void>,_0UL> local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  basic_random_coro_file<(coro_io::execution_type)2> local_98;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy_04;
  
  local_100._M_allocated_capacity = (size_type)&local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,filename._M_str,filename._M_str + (long)filename._M_len);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_100;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_1c8 + 8),__l,(allocator_type *)&local_98);
  create_files((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_1c8 + 8),0xbe);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 8));
  if ((basic_executor_type<std::allocator<void>,_0UL> *)local_100._M_allocated_capacity != &local_f0
     ) {
    operator_delete((void *)local_100._M_allocated_capacity,local_f0.target_ + 1);
  }
  std::thread::hardware_concurrency();
  piVar4 = coro_io::g_block_io_context_pool<coro_io::io_context_pool>(0);
  LOCK();
  paVar1 = &piVar4->next_io_context_;
  uVar2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_1c0._0_8_ =
       *(uintptr_t *)
        ((long)(piVar4->executors).
               super__Vector_base<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [uVar2 % (ulong)((long)(piVar4->io_contexts_).
                                      super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(piVar4->io_contexts_).
                                      super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4)]._M_t.
               super___uniq_ptr_impl<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>
               ._M_t + 0x28);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::basic_random_coro_file
            ((basic_random_coro_file<(coro_io::execution_type)2> *)&local_100,filename,_S_in,
             (executor_type *)(local_1c8 + 8));
  local_1c0._0_8_ = &local_100;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            ((anon_class_8_1_898ba27a *)(local_1c8 + 8));
  local_1c0._0_8_ = &local_100;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            ((anon_class_8_1_898ba27a *)(local_1c8 + 8));
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_read_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)(local_1c8 + 8),
             (uint64_t)&local_100,(char *)0x0,(size_t)&local_98);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            (&local_158,(coro *)(local_1c8 + 8),lazy);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (*(code *)(((string *)(local_1c0._0_8_ + 8))->_M_dataplus)._M_p)();
  }
  local_1c0._0_8_ = &local_98;
  local_1c0._8_8_ = &local_158;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_16_2_20c0d53e::operator()
            ((anon_class_16_2_20c0d53e *)(local_1c8 + 8));
  local_1c0._0_8_ = &local_100;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            ((anon_class_8_1_898ba27a *)(local_1c8 + 8));
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_read_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)local_1e8,(uint64_t)&local_100,
             (char *)0xa,(size_t)&local_98);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((pair<std::error_code,_unsigned_long> *)(local_1c8 + 8),(coro *)local_1e8,lazy_00);
  local_158.first._M_value = local_1c0._0_4_;
  local_158.first._4_4_ = local_1c0._4_4_;
  local_158.first._M_cat._0_4_ = local_1c0._8_4_;
  local_158.first._M_cat._4_4_ = local_1c0._12_4_;
  local_158.second = local_1c0._16_8_;
  if ((basic_random_coro_file<(coro_io::execution_type)2> *)local_1e8._0_8_ !=
      (basic_random_coro_file<(coro_io::execution_type)2> *)0x0) {
    (*(code *)(((ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
                 *)local_1e8._0_8_)->super_Executor)._name._M_dataplus._M_p)();
  }
  local_1c0._0_8_ = &local_100;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            ((anon_class_8_1_898ba27a *)(local_1c8 + 8));
  local_1c0._0_8_ = &local_158;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_89900fd8::operator()
            ((anon_class_8_1_89900fd8 *)(local_1c8 + 8));
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_read_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)local_1e8,(uint64_t)&local_100,
             (char *)0x6e,(size_t)&local_98);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((pair<std::error_code,_unsigned_long> *)(local_1c8 + 8),(coro *)local_1e8,lazy_01);
  local_158.first._M_value = local_1c0._0_4_;
  local_158.first._4_4_ = local_1c0._4_4_;
  local_158.first._M_cat._0_4_ = local_1c0._8_4_;
  local_158.first._M_cat._4_4_ = local_1c0._12_4_;
  local_158.second = local_1c0._16_8_;
  if ((basic_random_coro_file<(coro_io::execution_type)2> *)local_1e8._0_8_ !=
      (basic_random_coro_file<(coro_io::execution_type)2> *)0x0) {
    (*(code *)(((ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
                 *)local_1e8._0_8_)->super_Executor)._name._M_dataplus._M_p)();
  }
  local_1c0._0_8_ = &local_158;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_89900fd8::operator()
            ((anon_class_8_1_89900fd8 *)(local_1c8 + 8));
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_read_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)local_1e8,(uint64_t)&local_100,
             (char *)0xc8,(size_t)&local_98);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((pair<std::error_code,_unsigned_long> *)(local_1c8 + 8),(coro *)local_1e8,lazy_02);
  local_158.first._M_value = local_1c0._0_4_;
  local_158.first._4_4_ = local_1c0._4_4_;
  local_158.first._M_cat._0_4_ = local_1c0._8_4_;
  local_158.first._M_cat._4_4_ = local_1c0._12_4_;
  local_158.second = local_1c0._16_8_;
  if ((basic_random_coro_file<(coro_io::execution_type)2> *)local_1e8._0_8_ !=
      (basic_random_coro_file<(coro_io::execution_type)2> *)0x0) {
    (*(code *)(((ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
                 *)local_1e8._0_8_)->super_Executor)._name._M_dataplus._M_p)();
  }
  local_1c0._0_8_ = &local_100;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            ((anon_class_8_1_898ba27a *)(local_1c8 + 8));
  local_1c0._0_8_ = &local_158;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_89900fd8::operator()
            ((anon_class_8_1_89900fd8 *)(local_1c8 + 8));
  std::thread::hardware_concurrency();
  piVar4 = coro_io::g_block_io_context_pool<coro_io::io_context_pool>(0);
  LOCK();
  paVar1 = &piVar4->next_io_context_;
  uVar2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_198._M_allocated_capacity =
       *(size_type *)
        ((long)(piVar4->executors).
               super__Vector_base<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [uVar2 % (ulong)((long)(piVar4->io_contexts_).
                                      super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(piVar4->io_contexts_).
                                      super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4)]._M_t.
               super___uniq_ptr_impl<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>
               ._M_t + 0x28);
  local_1e8._16_4_ = 0x61666564;
  uStack_1d4 = 0x6c75;
  uStack_1d2 = 0x74;
  uStack_1d1 = 0;
  local_1a8[0] = 0x61666564;
  local_1a8[1]._0_2_ = 0x6c75;
  local_1a8[1]._2_1_ = 't';
  local_1a8[1]._3_1_ = '\0';
  local_1a0.target_ = (uintptr_t)local_1d0;
  local_1c0._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7;
  local_1c0._0_8_ = &PTR__ExecutorWrapper_00163e48;
  local_198._8_8_ = 0;
  _Stack_188._M_p = (pointer)0x0;
  local_178._M_allocated_capacity = 0;
  local_178._M_local_buf[8] = '\0';
  local_160 = 0;
  local_1c0._8_8_ = local_1a8;
  local_180 = local_178._M_local_buf + 8;
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::open
            ((basic_random_coro_file<(coro_io::execution_type)2> *)(local_1c8 + 8),
             (char *)filename._M_len,(int)filename._M_str,0x10);
  local_1e8._0_8_ = (basic_random_coro_file<(coro_io::execution_type)2> *)(local_1c8 + 8);
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_a7e8a955::operator()
            ((anon_class_8_1_a7e8a955 *)local_1e8);
  local_1e8._0_8_ = (basic_random_coro_file<(coro_io::execution_type)2> *)(local_1e8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"cccccccccc","");
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_1e8._8_8_;
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_write_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)local_118,
             (uint64_t)(local_1c8 + 8),(string_view)(auVar3 << 0x40));
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            (&local_138,(coro *)local_118,lazy_03);
  if ((_func_int **)local_118._0_8_ != (_func_int **)0x0) {
    (**(_func_int **)(local_118._0_8_ + 8))();
  }
  local_138.first._0_8_ = &local_138.second;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"dddddddddd","");
  buf_00._M_str = (char *)local_138.first._M_cat;
  buf_00._M_len = 10;
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_write_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)local_1c8,
             (uint64_t)(local_1c8 + 8),buf_00);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((pair<std::error_code,_unsigned_long> *)local_118,(coro *)local_1c8,lazy_04);
  if (local_1c8 != (undefined1  [8])0x0) {
    (**(code **)((long)local_1c8 + 8))();
  }
  if ((unsigned_long *)local_138.first._0_8_ != &local_138.second) {
    operator_delete((void *)local_138.first._0_8_,local_138.second + 1);
  }
  if ((basic_random_coro_file<(coro_io::execution_type)2> *)local_1e8._0_8_ !=
      (basic_random_coro_file<(coro_io::execution_type)2> *)(local_1e8 + 0x10)) {
    operator_delete((void *)local_1e8._0_8_,
                    CONCAT17(uStack_1d1,CONCAT16(uStack_1d2,CONCAT24(uStack_1d4,local_1e8._16_4_)))
                    + 1);
  }
  if (local_180 != local_178._M_local_buf + 8) {
    operator_delete(local_180,CONCAT71(local_178._9_7_,local_178._M_local_buf[8]) + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_188._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_188._M_p);
  }
  local_1c0._0_8_ = &PTR__Executor_00163ed8;
  if ((element_type *)local_1c0._8_8_ != local_1a8) {
    operator_delete((void *)local_1c0._8_8_,
                    CONCAT17(local_1a8[1]._3_1_,
                             CONCAT16(local_1a8[1]._2_1_,
                                      CONCAT24((undefined2)local_1a8[1],local_1a8[0]))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._8_8_ != &local_b0) {
    operator_delete((void *)local_c8._8_8_,local_b0._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_allocated_capacity);
  }
  local_100._M_allocated_capacity = (size_type)&PTR__Executor_00163ed8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._8_8_ != local_e8) {
    operator_delete((void *)local_100._8_8_,local_e8[0]._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void test_random_read_write(std::string_view filename) {
  create_files({std::string(filename)}, 190);
  coro_io::basic_random_coro_file<execute_type> file(filename, std::ios::in);
  CHECK(file.is_open());
#if defined(ENABLE_FILE_IO_URING) || defined(ASIO_WINDOWS)
  if (execute_type == coro_io::execution_type::native_async) {
    CHECK(file.get_execution_type() == coro_io::execution_type::native_async);
  }
#else
  CHECK(file.get_execution_type() == coro_io::execution_type::thread_pool);
#endif

  char buf[100];
  auto pair = async_simple::coro::syncAwait(file.async_read_at(0, buf, 10));
  CHECK(std::string_view(buf, pair.second) == "AAAAAAAAAA");
  CHECK(!file.eof());

  pair = async_simple::coro::syncAwait(file.async_read_at(10, buf, 100));
  CHECK(!file.eof());
  CHECK(pair.second == 100);

  pair = async_simple::coro::syncAwait(file.async_read_at(110, buf, 100));
  CHECK(pair.second == 80);

  // only read size equal 0 is eof.
  pair = async_simple::coro::syncAwait(file.async_read_at(200, buf, 100));
  CHECK(file.eof());
  CHECK(pair.second == 0);

  coro_io::basic_random_coro_file<execute_type> file1;
  file1.open(filename, std::ios::out);
  CHECK(file1.is_open());
  std::string buf1 = "cccccccccc";
  async_simple::coro::syncAwait(file1.async_write_at(0, buf1));

  std::string buf2 = "dddddddddd";
  async_simple::coro::syncAwait(file1.async_write_at(10, buf2));
}